

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

char * __thiscall
QUtf16::convertFromUnicode(QUtf16 *this,char *out,QStringView in,State *state,DataEndianness endian)

{
  undefined2 uVar1;
  storage_type_conflict *psVar2;
  QUtf16 *__src;
  int iVar3;
  
  iVar3 = (int)state;
  psVar2 = in.m_data;
  __src = (QUtf16 *)in.m_size;
  if ((psVar2[2] & L'\x01') == L'\0') {
    if (iVar3 == 0) {
      iVar3 = 2;
    }
    if ((*psVar2 & L'\x04') != L'\0') {
      uVar1 = 0xfeff;
      if (iVar3 == 1) {
        uVar1 = 0xfffe;
      }
      *(undefined2 *)this = uVar1;
      this = this + 2;
    }
LAB_00338d3d:
    if (iVar3 == 1) {
      qbswap<2>(__src,(qsizetype)out,this);
      goto LAB_00338d6a;
    }
  }
  else if (iVar3 != 0) goto LAB_00338d3d;
  if (this != __src) {
    memcpy(this,__src,(long)out * 2);
  }
LAB_00338d6a:
  psVar2[4] = L'\0';
  psVar2[5] = L'\0';
  psVar2[6] = L'\0';
  psVar2[7] = L'\0';
  *(byte *)(psVar2 + 2) = (byte)psVar2[2] | 1;
  return (char *)(this + (long)out * 2);
}

Assistant:

char *QUtf16::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state, DataEndianness endian)
{
    Q_ASSERT(state);
    bool writeBom = !(state->internalState & HeaderDone) && state->flags & QStringConverter::Flag::WriteBom;

    if (endian == DetectEndianness)
        endian = (QSysInfo::ByteOrder == QSysInfo::BigEndian) ? BigEndianness : LittleEndianness;

    if (writeBom) {
        // set them up the BOM
        QChar bom(QChar::ByteOrderMark);
        if (endian == BigEndianness)
            qToBigEndian(bom.unicode(), out);
        else
            qToLittleEndian(bom.unicode(), out);
        out += 2;
    }
    if (endian == BigEndianness)
        qToBigEndian<char16_t>(in.data(), in.size(), out);
    else
        qToLittleEndian<char16_t>(in.data(), in.size(), out);

    state->remainingChars = 0;
    state->internalState |= HeaderDone;
    return out + 2*in.size();
}